

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O2

string * __thiscall
cmCPackIFWGenerator::GetRootPackageName_abi_cxx11_
          (string *__return_storage_ptr__,cmCPackIFWGenerator *this)

{
  cmCPackIFWCommon *this_00;
  char *pcVar1;
  cmCPackIFWPackage package;
  allocator local_309;
  string local_308;
  cmCPackIFWPackage local_2e8;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"root",(allocator *)&local_2e8);
  std::__cxx11::string::string
            ((string *)&local_2e8,"CPACK_IFW_PACKAGE_GROUP",(allocator *)&local_308);
  this_00 = &this->super_cmCPackIFWCommon;
  pcVar1 = cmCPackIFWCommon::GetOption(this_00,(string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_2e8);
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::string::string
              ((string *)&local_2e8,"CPACK_IFW_PACKAGE_NAME",(allocator *)&local_308);
    pcVar1 = cmCPackIFWCommon::GetOption(this_00,(string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_2e8);
    if (pcVar1 == (char *)0x0) {
      std::__cxx11::string::string
                ((string *)&local_2e8,"CPACK_PACKAGE_NAME",(allocator *)&local_308);
      pcVar1 = cmCPackIFWCommon::GetOption(this_00,(string *)&local_2e8);
      std::__cxx11::string::~string((string *)&local_2e8);
      if (pcVar1 != (char *)0x0) {
        std::__cxx11::string::assign((char *)__return_storage_ptr__);
      }
    }
    else {
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
    }
  }
  else {
    cmCPackIFWPackage::cmCPackIFWPackage(&local_2e8);
    local_2e8.super_cmCPackIFWCommon.Generator = this;
    std::__cxx11::string::string((string *)&local_308,pcVar1,&local_309);
    cmCPackIFWPackage::ConfigureFromGroup(&local_2e8,&local_308);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    cmCPackIFWPackage::~cmCPackIFWPackage(&local_2e8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackIFWGenerator::GetRootPackageName()
{
  // Default value
  std::string name = "root";
  if (const char* optIFW_PACKAGE_GROUP =
        this->GetOption("CPACK_IFW_PACKAGE_GROUP")) {
    // Configure from root group
    cmCPackIFWPackage package;
    package.Generator = this;
    package.ConfigureFromGroup(optIFW_PACKAGE_GROUP);
    name = package.Name;
  } else if (const char* optIFW_PACKAGE_NAME =
               this->GetOption("CPACK_IFW_PACKAGE_NAME")) {
    // Configure from root package name
    name = optIFW_PACKAGE_NAME;
  } else if (const char* optPACKAGE_NAME =
               this->GetOption("CPACK_PACKAGE_NAME")) {
    // Configure from package name
    name = optPACKAGE_NAME;
  }
  return name;
}